

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
duckdb::Connection::CreateScalarFunction<signed_char,signed_char,signed_char>
          (Connection *this,string *name,_func_char_char_char *udf_func)

{
  type context;
  scalar_function_t function;
  _Any_data local_70;
  _Manager_type local_60;
  LogicalType local_50 [24];
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:158:36)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/function/udf_function.hpp:158:36)>
             ::_M_manager;
  local_38._M_unused._0_8_ = (undefined8)udf_func;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_70,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_38);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(local_50,INVALID);
  UDFWrapper::RegisterFunction<signed_char,signed_char,signed_char>
            (name,(scalar_function_t *)&local_70,context,local_50);
  duckdb::LogicalType::~LogicalType(local_50);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void CreateScalarFunction(const string &name, TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, udf_func);
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, function, *context);
	}